

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_average_block_as_solid(dxt1_endpoint_optimizer *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  unique_color *puVar7;
  byte *pbVar8;
  long *in_RDI;
  uint high_color_1;
  uint low_color_1;
  uint b;
  uint g;
  uint r;
  uint i_1;
  bool improved;
  uint high_color;
  uint low_color;
  uint ave_b;
  uint ave_g;
  uint ave_r;
  uint half_total_weight;
  uint weight;
  uint i;
  uint total_weight;
  uint64 tot_b;
  uint64 tot_g;
  uint64 tot_r;
  dxt1_solution_coordinates local_70;
  dxt1_solution_coordinates local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  dxt1_solution_coordinates local_4e;
  dxt1_solution_coordinates local_4a;
  bool local_45;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint uVar9;
  bool alternate_rounding;
  dxt1_solution_coordinates *coords;
  dxt1_endpoint_optimizer *this_00;
  long local_10;
  
  local_10 = 0;
  this_00 = (dxt1_endpoint_optimizer *)0x0;
  coords = (dxt1_solution_coordinates *)0x0;
  uVar9 = 0;
  for (local_28 = 0; uVar4 = local_28,
      uVar6 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 7)),
      uVar4 < uVar6; local_28 = local_28 + 1) {
    puVar7 = vector<crnlib::unique_color>::operator[]
                       ((vector<crnlib::unique_color> *)(in_RDI + 7),local_28);
    local_2c = puVar7->m_weight;
    uVar9 = local_2c + uVar9;
    puVar7 = vector<crnlib::unique_color>::operator[]
                       ((vector<crnlib::unique_color> *)(in_RDI + 7),local_28);
    local_10 = (ulong)(puVar7->m_color).field_0.field_0.r * (ulong)local_2c + local_10;
    puVar7 = vector<crnlib::unique_color>::operator[]
                       ((vector<crnlib::unique_color> *)(in_RDI + 7),local_28);
    this_00 = (dxt1_endpoint_optimizer *)
              ((long)this_00->m_rDist +
              (ulong)(puVar7->m_color).field_0.field_0.g * (ulong)local_2c + -0x68);
    puVar7 = vector<crnlib::unique_color>::operator[]
                       ((vector<crnlib::unique_color> *)(in_RDI + 7),local_28);
    coords = (dxt1_solution_coordinates *)
             ((long)&coords->m_low_color +
             (ulong)(puVar7->m_color).field_0.field_0.b * (ulong)local_2c);
  }
  local_30 = uVar9 >> 1;
  uVar1 = (local_10 + (ulong)local_30) / (ulong)uVar9;
  local_34 = (uint)uVar1;
  uVar2 = ((long)this_00->m_rDist + ((ulong)local_30 - 0x68)) / (ulong)uVar9;
  local_38 = (uint)uVar2;
  uVar3 = ((long)&coords->m_low_color + (ulong)local_30) / (ulong)uVar9;
  local_3c = (uint)uVar3;
  local_40 = (uint)(byte)ryg_dxt::OMatch5[(uVar1 & 0xffffffff) * 2] << 0xb |
             (uint)(byte)ryg_dxt::OMatch6[(uVar2 & 0xffffffff) * 2] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(uVar3 & 0xffffffff) * 2];
  local_44 = (uint)(byte)ryg_dxt::OMatch5[(uVar1 & 0xffffffff) * 2 + 1] << 0xb |
             (uint)(byte)ryg_dxt::OMatch6[(uVar2 & 0xffffffff) * 2 + 1] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(uVar3 & 0xffffffff) * 2 + 1];
  dxt1_solution_coordinates::dxt1_solution_coordinates(&local_4a,(uint16)local_40,(uint16)local_44);
  alternate_rounding = SUB41(uVar9 >> 0x18,0);
  local_45 = evaluate_solution(this_00,coords,alternate_rounding);
  if (((*(byte *)(*in_RDI + 0x1d) & 1) != 0) && (in_RDI[0x12e] != 0)) {
    local_40 = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_34 * 2] << 0xb |
               (uint)(byte)ryg_dxt::OMatch6_3[(ulong)local_38 * 2] << 5 |
               (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_3c * 2];
    local_44 = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_34 * 2 + 1] << 0xb |
               (uint)(byte)ryg_dxt::OMatch6_3[(ulong)local_38 * 2 + 1] << 5 |
               (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_3c * 2 + 1];
    dxt1_solution_coordinates::dxt1_solution_coordinates
              (&local_4e,(uint16)local_40,(uint16)local_44);
    bVar5 = evaluate_solution(this_00,coords,alternate_rounding);
    local_45 = (local_45 & 1U) != 0 || bVar5;
  }
  if (*(int *)(*in_RDI + 0x18) == 4) {
    for (local_54 = 0; uVar9 = local_54,
        uVar6 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 7)),
        uVar9 < uVar6; local_54 = local_54 + 1) {
      puVar7 = vector<crnlib::unique_color>::operator[]
                         ((vector<crnlib::unique_color> *)(in_RDI + 7),local_54);
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&puVar7->m_color,0);
      local_58 = (uint)*pbVar8;
      puVar7 = vector<crnlib::unique_color>::operator[]
                         ((vector<crnlib::unique_color> *)(in_RDI + 7),local_54);
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&puVar7->m_color,1);
      local_5c = (uint)*pbVar8;
      puVar7 = vector<crnlib::unique_color>::operator[]
                         ((vector<crnlib::unique_color> *)(in_RDI + 7),local_54);
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&puVar7->m_color,2);
      local_60 = (uint)*pbVar8;
      if (((local_58 != local_34) || (local_5c != local_38)) || (local_60 != local_3c)) {
        local_64 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_58 * 2] << 0xb |
                   (uint)(byte)ryg_dxt::OMatch6[(ulong)local_5c * 2] << 5 |
                   (uint)(byte)ryg_dxt::OMatch5[(ulong)local_60 * 2];
        local_68 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_58 * 2 + 1] << 0xb |
                   (uint)(byte)ryg_dxt::OMatch6[(ulong)local_5c * 2 + 1] << 5 |
                   (uint)(byte)ryg_dxt::OMatch5[(ulong)local_60 * 2 + 1];
        dxt1_solution_coordinates::dxt1_solution_coordinates
                  (&local_6c,(uint16)local_64,(uint16)local_68);
        bVar5 = evaluate_solution(this_00,coords,alternate_rounding);
        local_45 = (local_45 & 1U) != 0 || bVar5;
        if (((*(byte *)(*in_RDI + 0x1d) & 1) != 0) && (in_RDI[0x12e] != 0)) {
          local_64 = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_58 * 2] << 0xb |
                     (uint)(byte)ryg_dxt::OMatch6_3[(ulong)local_5c * 2] << 5 |
                     (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_60 * 2];
          local_68 = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_58 * 2 + 1] << 0xb |
                     (uint)(byte)ryg_dxt::OMatch6_3[(ulong)local_5c * 2 + 1] << 5 |
                     (uint)(byte)ryg_dxt::OMatch5_3[(ulong)local_60 * 2 + 1];
          dxt1_solution_coordinates::dxt1_solution_coordinates
                    (&local_70,(uint16)local_64,(uint16)local_68);
          bVar5 = evaluate_solution(this_00,coords,alternate_rounding);
          local_45 = (local_45 & 1U) != 0 || bVar5;
        }
      }
    }
  }
  return (bool)(local_45 & 1);
}

Assistant:

bool dxt1_endpoint_optimizer::try_average_block_as_solid() {
  uint64 tot_r = 0;
  uint64 tot_g = 0;
  uint64 tot_b = 0;

  uint total_weight = 0;
  for (uint i = 0; i < m_unique_colors.size(); i++) {
    uint weight = m_unique_colors[i].m_weight;
    total_weight += weight;

    tot_r += m_unique_colors[i].m_color.r * static_cast<uint64>(weight);
    tot_g += m_unique_colors[i].m_color.g * static_cast<uint64>(weight);
    tot_b += m_unique_colors[i].m_color.b * static_cast<uint64>(weight);
  }

  const uint half_total_weight = total_weight >> 1;
  uint ave_r = static_cast<uint>((tot_r + half_total_weight) / total_weight);
  uint ave_g = static_cast<uint>((tot_g + half_total_weight) / total_weight);
  uint ave_b = static_cast<uint>((tot_b + half_total_weight) / total_weight);

  uint low_color = (ryg_dxt::OMatch5[ave_r][0] << 11) | (ryg_dxt::OMatch6[ave_g][0] << 5) | ryg_dxt::OMatch5[ave_b][0];
  uint high_color = (ryg_dxt::OMatch5[ave_r][1] << 11) | (ryg_dxt::OMatch6[ave_g][1] << 5) | ryg_dxt::OMatch5[ave_b][1];
  bool improved = evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

  if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error)) {
    low_color = (ryg_dxt::OMatch5_3[ave_r][0] << 11) | (ryg_dxt::OMatch6_3[ave_g][0] << 5) | ryg_dxt::OMatch5_3[ave_b][0];
    high_color = (ryg_dxt::OMatch5_3[ave_r][1] << 11) | (ryg_dxt::OMatch6_3[ave_g][1] << 5) | ryg_dxt::OMatch5_3[ave_b][1];
    improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
  }

  if (m_pParams->m_quality == cCRNDXTQualityUber) {
    // Try compressing as all-solid using the other (non-average) colors in the block in uber.
    for (uint i = 0; i < m_unique_colors.size(); i++) {
      uint r = m_unique_colors[i].m_color[0];
      uint g = m_unique_colors[i].m_color[1];
      uint b = m_unique_colors[i].m_color[2];
      if ((r == ave_r) && (g == ave_g) && (b == ave_b))
        continue;

      uint low_color = (ryg_dxt::OMatch5[r][0] << 11) | (ryg_dxt::OMatch6[g][0] << 5) | ryg_dxt::OMatch5[b][0];
      uint high_color = (ryg_dxt::OMatch5[r][1] << 11) | (ryg_dxt::OMatch6[g][1] << 5) | ryg_dxt::OMatch5[b][1];
      improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

      if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error)) {
        low_color = (ryg_dxt::OMatch5_3[r][0] << 11) | (ryg_dxt::OMatch6_3[g][0] << 5) | ryg_dxt::OMatch5_3[b][0];
        high_color = (ryg_dxt::OMatch5_3[r][1] << 11) | (ryg_dxt::OMatch6_3[g][1] << 5) | ryg_dxt::OMatch5_3[b][1];
        improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
      }
    }
  }

  return improved;
}